

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O2

void affect_to_obj(OBJ_DATA *obj,OBJ_AFFECT_DATA *paf)

{
  OBJ_AFFECT_DATA *paf_00;
  long lVar1;
  OBJ_AFFECT_DATA *pOVar2;
  byte bVar3;
  
  bVar3 = 0;
  paf_00 = new_affect_obj();
  pOVar2 = paf_00;
  for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pOVar2->next = paf->next;
    paf = (OBJ_AFFECT_DATA *)((long)paf + (ulong)bVar3 * -0x10 + 8);
    pOVar2 = (OBJ_AFFECT_DATA *)((long)pOVar2 + (ulong)bVar3 * -0x10 + 8);
  }
  paf_00->next = obj->affected;
  obj->affected = paf_00;
  affect_modify_obj(obj,paf_00,true);
  return;
}

Assistant:

void affect_to_obj(OBJ_DATA *obj, OBJ_AFFECT_DATA *paf)
{
	OBJ_AFFECT_DATA *paf_new;

	paf_new = new_affect_obj();

	*paf_new = *paf;
	paf_new->next = obj->affected;
	obj->affected = paf_new;

	affect_modify_obj(obj, paf_new, true);
}